

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_start.c
# Opt level: O0

void start(int thread)

{
  pthread_t __th;
  long lVar1;
  int iVar2;
  monitor *pmVar3;
  skynet_monitor **ppsVar4;
  skynet_monitor *psVar5;
  pthread_t *arg;
  long lVar6;
  pthread_mutex_t *__mutex;
  pthread_cond_t *__cond;
  pthread_t *ppVar7;
  pthread_t *thread_00;
  pthread_t pStack_50;
  pthread_t *local_48 [2];
  ulong local_38;
  unsigned_long __vla_expr1;
  monitor *pmStack_28;
  int i;
  monitor *m;
  unsigned_long __vla_expr0;
  uint local_c;
  int thread_local;
  
  __vla_expr0 = (unsigned_long)local_48;
  m = (monitor *)(ulong)(thread + 3);
  lVar1 = -((long)m * 8 + 0xfU & 0xfffffffffffffff0);
  local_48[1] = (pthread_t *)((long)local_48 + lVar1);
  local_c = thread;
  *(undefined8 *)((long)&pStack_50 + lVar1) = 0x11550f;
  pmVar3 = (monitor *)malloc(0x70);
  pmStack_28 = pmVar3;
  *(undefined8 *)((long)&pStack_50 + lVar1) = 0x115523;
  memset(pmVar3,0,0x70);
  pmStack_28->count = local_c;
  pmStack_28->sleep = 0;
  lVar6 = (long)(int)local_c;
  *(undefined8 *)((long)&pStack_50 + lVar1) = 0x115544;
  ppsVar4 = (skynet_monitor **)malloc(lVar6 << 3);
  pmStack_28->m = ppsVar4;
  for (__vla_expr1._4_4_ = 0; (int)__vla_expr1._4_4_ < (int)local_c;
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    *(undefined8 *)((long)&pStack_50 + lVar1) = 0x115565;
    psVar5 = skynet_monitor_new();
    pmStack_28->m[(int)__vla_expr1._4_4_] = psVar5;
  }
  __mutex = &pmStack_28->mutex;
  *(undefined8 *)((long)&pStack_50 + lVar1) = 0x115594;
  iVar2 = pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  if (iVar2 != 0) {
    *(undefined8 *)((long)&pStack_50 + lVar1) = 0x1155b1;
    fprintf(_stderr,"Init mutex error");
    *(undefined8 *)((long)&pStack_50 + lVar1) = 0x1155bb;
    exit(1);
  }
  __cond = &pmStack_28->cond;
  *(undefined8 *)((long)&pStack_50 + lVar1) = 0x1155cc;
  iVar2 = pthread_cond_init((pthread_cond_t *)__cond,(pthread_condattr_t *)0x0);
  pmVar3 = pmStack_28;
  ppVar7 = local_48[1];
  if (iVar2 != 0) {
    *(undefined8 *)((long)&pStack_50 + lVar1) = 0x1155e9;
    fprintf(_stderr,"Init cond error");
    *(undefined8 *)((long)&pStack_50 + lVar1) = 0x1155f3;
    exit(1);
  }
  *(undefined8 *)((long)&pStack_50 + lVar1) = 0x115607;
  create_thread(ppVar7,thread_monitor,pmVar3);
  pmVar3 = pmStack_28;
  ppVar7 = local_48[1] + 1;
  *(undefined8 *)((long)&pStack_50 + lVar1) = 0x11561f;
  create_thread(ppVar7,thread_timer,pmVar3);
  pmVar3 = pmStack_28;
  ppVar7 = local_48[1] + 2;
  *(undefined8 *)((long)&pStack_50 + lVar1) = 0x115637;
  create_thread(ppVar7,thread_socket,pmVar3);
  local_38 = (ulong)local_c;
  ppVar7 = (pthread_t *)((long)local_48 + lVar1) + local_38 * -2;
  local_48[0] = ppVar7;
  for (__vla_expr1._4_4_ = 0; (int)__vla_expr1._4_4_ < (int)local_c;
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    local_48[0][(long)(int)__vla_expr1._4_4_ * 2] = (pthread_t)pmStack_28;
    *(uint *)(local_48[0] + (long)(int)__vla_expr1._4_4_ * 2 + 1) = __vla_expr1._4_4_;
    if (__vla_expr1._4_4_ < 0x20) {
      *(int *)((long)local_48[0] + (long)(int)__vla_expr1._4_4_ * 0x10 + 0xc) =
           start::weight[(int)__vla_expr1._4_4_];
    }
    else {
      *(undefined4 *)((long)local_48[0] + (long)(int)__vla_expr1._4_4_ * 0x10 + 0xc) = 0;
    }
    thread_00 = local_48[1] + (int)(__vla_expr1._4_4_ + 3);
    arg = local_48[0] + (long)(int)__vla_expr1._4_4_ * 2;
    ppVar7[-1] = 0x1156ff;
    create_thread(thread_00,thread_worker,arg);
  }
  for (__vla_expr1._4_4_ = 0; pmVar3 = pmStack_28, (int)__vla_expr1._4_4_ < (int)(local_c + 3);
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    __th = local_48[1][(int)__vla_expr1._4_4_];
    ppVar7[-1] = 0x115736;
    pthread_join(__th,(void **)0x0);
  }
  ppVar7[-1] = 0x11574a;
  free_monitor(pmVar3);
  return;
}

Assistant:

static void
start(int thread) {
	pthread_t pid[thread+3];

	struct monitor *m = skynet_malloc(sizeof(*m));
	memset(m, 0, sizeof(*m));
	m->count = thread;
	m->sleep = 0;

	m->m = skynet_malloc(thread * sizeof(struct skynet_monitor *));
	int i;
	for (i=0;i<thread;i++) {
		m->m[i] = skynet_monitor_new();
	}
	if (pthread_mutex_init(&m->mutex, NULL)) {
		fprintf(stderr, "Init mutex error");
		exit(1);
	}
	if (pthread_cond_init(&m->cond, NULL)) {
		fprintf(stderr, "Init cond error");
		exit(1);
	}

	create_thread(&pid[0], thread_monitor, m);
	create_thread(&pid[1], thread_timer, m);
	create_thread(&pid[2], thread_socket, m);

	static int weight[] = { 
		-1, -1, -1, -1, 0, 0, 0, 0,
		1, 1, 1, 1, 1, 1, 1, 1, 
		2, 2, 2, 2, 2, 2, 2, 2, 
		3, 3, 3, 3, 3, 3, 3, 3, };
	struct worker_parm wp[thread];
	for (i=0;i<thread;i++) {
		wp[i].m = m;
		wp[i].id = i;
		if (i < sizeof(weight)/sizeof(weight[0])) {
			wp[i].weight= weight[i];
		} else {
			wp[i].weight = 0;
		}
		create_thread(&pid[i+3], thread_worker, &wp[i]);
	}

	for (i=0;i<thread+3;i++) {
		pthread_join(pid[i], NULL); 
	}

	free_monitor(m);
}